

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

times * __thiscall
lest::for_test<lest::times>(lest *this,tests *specification,texts *in,times *perform,int n)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  times *ptVar4;
  int iVar5;
  fd_set *__exceptfds;
  fd_set *__writefds;
  long *plVar6;
  long *plVar7;
  undefined4 in_register_00000084;
  int local_a8;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  test local_70;
  
  iVar5 = (int)perform;
  __exceptfds = (fd_set *)CONCAT71((int7)((ulong)perform >> 8),iVar5 < 1);
  if (iVar5 == -1 || iVar5 >= 1) {
    paVar1 = &local_70.name.field_2;
    plVar7 = *(long **)(this + 8);
    local_a8 = 0;
    do {
      plVar6 = *(long **)this;
      if (plVar6 != plVar7) {
        do {
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char*>((string *)local_90,*plVar6,plVar6[1] + *plVar6);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xffffffffffffffb8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)specification);
          iVar3 = select((int)(string *)local_90,(fd_set *)&stack0xffffffffffffffb8,__writefds,
                         __exceptfds,(timeval *)CONCAT44(in_register_00000084,n));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&stack0xffffffffffffffb8);
          if (local_90[0] != local_80) {
            operator_delete(local_90[0]);
          }
          if ((char)iVar3 != '\0') {
            local_70.name._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,*plVar6,plVar6[1] + *plVar6);
            local_70.behaviour = (_func_void_env_ptr *)plVar6[4];
            ptVar4 = times::operator()((times *)in,&local_70);
            iVar3 = ptVar4->failures;
            bVar2 = (ptVar4->output).opt.abort;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70.name._M_dataplus._M_p != paVar1) {
              operator_delete(local_70.name._M_dataplus._M_p);
            }
            if ((0 < iVar3 & bVar2) != 0) {
              return (times *)in;
            }
          }
          plVar7 = plVar6 + 5;
          plVar6 = plVar7;
        } while (plVar7 != *(long **)(this + 8));
      }
      local_a8 = local_a8 + 1;
      __exceptfds = (fd_set *)
                    (ulong)CONCAT31((int3)((ulong)perform >> 8),iVar5 <= local_a8 && iVar5 != -1);
    } while (iVar5 > local_a8 || iVar5 == -1);
  }
  return (times *)in;
}

Assistant:

Action & for_test( tests specification, texts in, Action & perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( tests::iterator pos = specification.begin(); pos != specification.end() ; ++pos )
        {
            test & testing = *pos;

            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return perform;
        }
    }
    return perform;
}